

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Region.hpp
# Opt level: O1

void __thiscall
__gnu_cxx::new_allocator<remote::Region>::construct<remote::Region,remote::Region>
          (new_allocator<remote::Region> *this,Region *__p,Region *__args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  undefined8 uVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined4 uVar13;
  
  __p->inodeFileNumber = __args->inodeFileNumber;
  sVar4 = __args->start;
  sVar5 = __args->end;
  bVar9 = __args->read;
  bVar10 = __args->write;
  bVar11 = __args->exec;
  bVar12 = __args->shared;
  uVar13 = *(undefined4 *)&__args->field_0x14;
  sVar6 = __args->offset;
  sVar7 = __args->deviceMinor;
  __p->deviceMajor = __args->deviceMajor;
  __p->deviceMinor = sVar7;
  __p->read = bVar9;
  __p->write = bVar10;
  __p->exec = bVar11;
  __p->shared = bVar12;
  *(undefined4 *)&__p->field_0x14 = uVar13;
  __p->offset = sVar6;
  __p->start = sVar4;
  __p->end = sVar5;
  paVar1 = &(__p->pathname).field_2;
  (__p->pathname)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (__args->pathname)._M_dataplus._M_p;
  paVar2 = &(__args->pathname).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar8 = *(undefined8 *)((long)&(__args->pathname).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(__p->pathname).field_2 + 8) = uVar8;
  }
  else {
    (__p->pathname)._M_dataplus._M_p = pcVar3;
    (__p->pathname).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (__p->pathname)._M_string_length = (__args->pathname)._M_string_length;
  (__args->pathname)._M_dataplus._M_p = (pointer)paVar2;
  (__args->pathname)._M_string_length = 0;
  (__args->pathname).field_2._M_local_buf[0] = '\0';
  paVar1 = &(__p->filename).field_2;
  (__p->filename)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (__args->filename)._M_dataplus._M_p;
  paVar2 = &(__args->filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar8 = *(undefined8 *)((long)&(__args->filename).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(__p->filename).field_2 + 8) = uVar8;
  }
  else {
    (__p->filename)._M_dataplus._M_p = pcVar3;
    (__p->filename).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (__p->filename)._M_string_length = (__args->filename)._M_string_length;
  (__args->filename)._M_dataplus._M_p = (pointer)paVar2;
  (__args->filename)._M_string_length = 0;
  (__args->filename).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Region() {
            start = end = 0;
            read = write = exec = shared = false;
            offset = deviceMajor = deviceMinor = inodeFileNumber = 0;
            pathname.clear();
            filename.clear();
        }